

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O0

rb_node * lyds_get_rb_tree(lyd_node *leader,lyd_meta **meta)

{
  int iVar1;
  rb_node *local_40;
  lyd_value_lyds_tree *_lt;
  lyd_meta *iter;
  rb_node *rbt;
  lyd_meta **meta_local;
  lyd_node *leader_local;
  
  if (meta != (lyd_meta **)0x0) {
    *meta = (lyd_meta *)0x0;
  }
  _lt = (lyd_value_lyds_tree *)leader->meta;
  while( true ) {
    if (_lt == (lyd_value_lyds_tree *)0x0) {
      return (rb_node *)0x0;
    }
    iVar1 = strcmp((char *)_lt[3].rbt,"lyds_tree");
    if (iVar1 == 0) break;
    _lt = (lyd_value_lyds_tree *)_lt[1].rbt;
  }
  if (meta != (lyd_meta **)0x0) {
    *meta = (lyd_meta *)_lt;
  }
  if (_lt + 6 == (lyd_value_lyds_tree *)0x0) {
    local_40 = (rb_node *)0x0;
  }
  else {
    local_40 = _lt[6].rbt;
  }
  return local_40;
}

Assistant:

static struct rb_node *
lyds_get_rb_tree(const struct lyd_node *leader, struct lyd_meta **meta)
{
    struct rb_node *rbt;
    struct lyd_meta *iter;

    if (meta) {
        *meta = NULL;
    }
    LY_LIST_FOR(leader->meta, iter) {
        if (!strcmp(iter->name, "lyds_tree")) {
            if (meta) {
                *meta = iter;
            }
            RBT_GET(iter, rbt);
            return rbt;
        }
    }

    return NULL;
}